

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::copy_R_and_t
          (Epnp *this,double (*R_src) [3],double *t_src,double (*R_dst) [3],double *t_dst)

{
  int i;
  long lVar1;
  long lVar2;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      (*R_dst)[lVar2] = (*R_src)[lVar2];
    }
    R_dst = R_dst + 1;
    R_src = R_src + 1;
    t_dst[lVar1] = t_src[lVar1];
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::copy_R_and_t(
    const double R_src[3][3],
    const double t_src[3],
    double R_dst[3][3],
    double t_dst[3])
{
  for(int i = 0; i < 3; i++)
  {
    for(int j = 0; j < 3; j++)
      R_dst[i][j] = R_src[i][j];
    t_dst[i] = t_src[i];
  }
}